

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::fillWithRepeatableGradient(PixelBufferAccess *access,Vec4 *colorA,Vec4 *colorB)

{
  Vec4 *this;
  int iVar1;
  float fVar2;
  float local_64;
  float local_60;
  Vec4 local_4c;
  float local_3c;
  float local_38;
  float p;
  float b;
  float a;
  float t;
  float s;
  int x;
  int y;
  Vec4 *colorB_local;
  Vec4 *colorA_local;
  PixelBufferAccess *access_local;
  
  s = 0.0;
  _x = colorB;
  colorB_local = colorA;
  colorA_local = (Vec4 *)access;
  while( true ) {
    fVar2 = s;
    iVar1 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)colorA_local);
    if (iVar1 <= (int)fVar2) break;
    t = 0.0;
    while( true ) {
      fVar2 = t;
      iVar1 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)colorA_local);
      if (iVar1 <= (int)fVar2) break;
      fVar2 = (float)(int)t;
      iVar1 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)colorA_local);
      a = (fVar2 + 0.5) / (float)iVar1;
      fVar2 = (float)(int)s;
      iVar1 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)colorA_local);
      b = (fVar2 + 0.5) / (float)iVar1;
      if (a <= 0.5) {
        local_60 = a * 2.0;
      }
      else {
        local_60 = 2.0 - (a + a);
      }
      p = local_60;
      if (b <= 0.5) {
        local_64 = b * 2.0;
      }
      else {
        local_64 = 2.0 - (b + b);
      }
      local_38 = local_64;
      fVar2 = ::deFloatSqrt(local_60 * local_60 + local_64 * local_64);
      local_3c = deFloatClamp(fVar2,0.0,1.0);
      this = colorA_local;
      linearInterpolate((tcu *)&local_4c,local_3c,colorB_local,_x);
      PixelBufferAccess::setPixel((PixelBufferAccess *)this,&local_4c,(int)t,(int)s,0);
      t = (float)((int)t + 1);
    }
    s = (float)((int)s + 1);
  }
  return;
}

Assistant:

void fillWithRepeatableGradient (const PixelBufferAccess& access, const Vec4& colorA, const Vec4& colorB)
{
	for (int y = 0; y < access.getHeight(); y++)
	{
		for (int x = 0; x < access.getWidth(); x++)
		{
			float s = ((float)x + 0.5f) / (float)access.getWidth();
			float t = ((float)y + 0.5f) / (float)access.getHeight();

			float a = s > 0.5f ? (2.0f - 2.0f*s) : 2.0f*s;
			float b = t > 0.5f ? (2.0f - 2.0f*t) : 2.0f*t;

			float p = deFloatClamp(deFloatSqrt(a*a + b*b), 0.0f, 1.0f);
			access.setPixel(linearInterpolate(p, colorA, colorB), x, y);
		}
	}
}